

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_by_extension(REF_GRID ref_grid,char *filename)

{
  char *__s1;
  REF_CELL_TYPE RVar1;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  size_t sVar10;
  REF_CELL *ppRVar11;
  void *__s;
  void *__ptr;
  FILE *pFVar12;
  REF_NODE pRVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  int iVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  REF_INT RVar22;
  int iVar23;
  char *__s1_00;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  REF_INT *o2n;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT ncell;
  char temp_filename [28];
  REF_INT nodes [27];
  ulong local_4f8;
  REF_INT *local_4e0;
  undefined8 local_4d8;
  uint local_4cc;
  REF_DICT local_4c8;
  uint local_4bc;
  undefined8 local_4b8;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int local_49c;
  REF_NODE local_448;
  REF_CELL *local_440;
  uint local_438 [4];
  int iStack_428;
  int iStack_424;
  int iStack_420;
  int local_41c;
  int local_418;
  int local_414;
  
  sVar10 = strlen(filename);
  pcVar19 = filename + (sVar10 - 4);
  iVar5 = strcmp(pcVar19,".vtk");
  if (iVar5 == 0) {
    pRVar13 = ref_grid->node;
    pFVar12 = fopen(filename,"w");
    if (pFVar12 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x9b
             ,"ref_export_vtk","unable to open file");
      uVar16 = 2;
    }
    else {
      fwrite("# vtk DataFile Version 2.0\n",0x1b,1,pFVar12);
      fwrite("ref_export_vtk\n",0xf,1,pFVar12);
      fwrite("ASCII\n",6,1,pFVar12);
      uVar6 = ref_node_compact(pRVar13,(REF_INT **)&local_4b8,&local_4e0);
      if (uVar6 == 0) {
        fwrite("DATASET UNSTRUCTURED_GRID\n",0x1a,1,pFVar12);
        uVar16 = 0;
        fprintf(pFVar12,"POINTS %d double\n",(ulong)(uint)pRVar13->n);
        if (0 < pRVar13->n) {
          lVar21 = 0;
          do {
            pRVar2 = pRVar13->real;
            lVar15 = (long)local_4e0[lVar21];
            fprintf(pFVar12," %.16e %.16e %.16e\n",SUB84(pRVar2[lVar15 * 0xf],0),
                    pRVar2[lVar15 * 0xf + 1],pRVar2[lVar15 * 0xf + 2]);
            lVar21 = lVar21 + 1;
          } while (lVar21 < pRVar13->n);
        }
        pRVar13 = (REF_NODE)(ref_grid->cell + 3);
        lVar21 = 0;
        uVar24 = 0;
        do {
          iVar5 = *(int *)(*(long *)(&pRVar13->n + lVar21 * 2) + 0x28);
          uVar16 = (ulong)(uint)((int)uVar16 + iVar5);
          uVar24 = (ulong)(uint)((int)uVar24 +
                                (*(int *)(*(long *)(&pRVar13->n + lVar21 * 2) + 0xc) + 1) * iVar5);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0xd);
        fprintf(pFVar12,"CELLS %d %d\n",uVar16,uVar24);
        lVar21 = 3;
        local_4d8 = pRVar13;
        do {
          pRVar3 = *(REF_CELL *)pRVar13;
          if (0 < pRVar3->max) {
            uVar6 = pRVar3->node_per;
            uVar24 = (ulong)uVar6;
            RVar22 = 0;
            do {
              RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)local_438);
              if (RVar8 == 0) {
                fprintf(pFVar12," %d",uVar24);
                uVar4 = local_438[2];
                uVar20 = local_438[1];
                uVar9 = local_438[0];
                uVar7 = local_438[3];
                if (uVar24 == 6) {
LAB_0012314b:
                  local_438[1] = uVar9;
                  local_438[0] = uVar20;
                  local_438[3] = iStack_428;
                  iStack_428 = uVar7;
                }
                else if (uVar6 == 5) {
                  local_438[0] = local_438[1];
                  local_438[1] = uVar9;
                  local_438[2] = local_438[3];
                  uVar7 = uVar4;
                  goto LAB_0012314b;
                }
                if (0 < (int)uVar6) {
                  uVar25 = 0;
                  do {
                    fprintf(pFVar12," %d",
                            (ulong)*(uint *)(CONCAT44(local_4b8._4_4_,(uint)local_4b8) +
                                            (long)(int)local_438[uVar25] * 4));
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                fputc(10,pFVar12);
              }
              RVar22 = RVar22 + 1;
            } while (RVar22 < pRVar3->max);
          }
          pRVar13 = (REF_NODE)(ref_grid->cell + lVar21 + 1);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x10);
        fprintf(pFVar12,"CELL_TYPES %d\n",uVar16);
        lVar21 = *(long *)local_4d8;
        if (0 < *(int *)(lVar21 + 0x2c)) {
          iVar5 = 0;
          do {
            if (*(int *)(*(long *)(lVar21 + 0x38) + (long)iVar5 * (long)*(int *)(lVar21 + 8) * 4) !=
                -1) {
              fprintf(pFVar12," %d\n",5);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < *(int *)(lVar21 + 0x2c));
        }
        pRVar3 = ref_grid->cell[6];
        if (0 < pRVar3->max) {
          iVar5 = 0;
          do {
            if (pRVar3->c2n[(long)iVar5 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar12," %d\n",9);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < pRVar3->max);
        }
        pRVar3 = ref_grid->cell[8];
        if (0 < pRVar3->max) {
          iVar5 = 0;
          do {
            if (pRVar3->c2n[(long)iVar5 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar12," %d\n",10);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < pRVar3->max);
        }
        pRVar3 = ref_grid->cell[9];
        if (0 < pRVar3->max) {
          iVar5 = 0;
          do {
            if (pRVar3->c2n[(long)iVar5 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar12," %d\n",0xe);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < pRVar3->max);
        }
        pRVar3 = ref_grid->cell[10];
        if (0 < pRVar3->max) {
          iVar5 = 0;
          do {
            if (pRVar3->c2n[(long)iVar5 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar12," %d\n",0xd);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < pRVar3->max);
        }
        pRVar3 = ref_grid->cell[0xb];
        if (0 < pRVar3->max) {
          iVar5 = 0;
          do {
            if (pRVar3->c2n[(long)iVar5 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar12," %d\n",0xc);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < pRVar3->max);
        }
        if (local_4e0 != (REF_INT *)0x0) {
          free(local_4e0);
        }
        if ((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8) != (void *)0x0) {
          free((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8));
        }
        fclose(pFVar12);
        uVar16 = 0;
      }
      else {
        uVar16 = (ulong)uVar6;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa1,"ref_export_vtk",(ulong)uVar6,"compact");
      }
    }
    if ((int)uVar16 == 0) {
      return 0;
    }
    pcVar19 = "vtk export failed";
    uVar17 = 0xaa0;
  }
  else {
    iVar5 = strcmp(filename + (sVar10 - 2),".c");
    if (iVar5 == 0) {
      pRVar13 = ref_grid->node;
      pFVar12 = fopen(filename,"w");
      if (pFVar12 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6a1,"ref_export_c","unable to open file");
        uVar16 = 2;
      }
      else {
        uVar6 = ref_node_compact(pRVar13,(REF_INT **)&local_4b8,&local_4e0);
        if (uVar6 == 0) {
          if (0 < pRVar13->n) {
            uVar16 = 0;
            do {
              fprintf(pFVar12,"  RSS(ref_node_add(ref_node,%d,&node),\"node\");\n",
                      uVar16 & 0xffffffff);
              uVar24 = 0;
              do {
                fprintf(pFVar12,"  ref_node_xyz(ref_node,%d,node) = %.15e;\n",
                        SUB84(pRVar13->real[(long)local_4e0[uVar16] * 0xf + uVar24],0),
                        uVar24 & 0xffffffff);
                uVar24 = uVar24 + 1;
              } while ((int)uVar24 != 3);
              uVar16 = uVar16 + 1;
            } while ((long)uVar16 < (long)pRVar13->n);
          }
          pRVar3 = ref_grid->cell[6];
          if (0 < pRVar3->max) {
            RVar22 = 0;
            do {
              RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)local_438);
              if (RVar8 == 0) {
                if (0 < pRVar3->size_per) {
                  uVar16 = 0;
                  do {
                    fprintf(pFVar12,"  nodes[%d] = %d;\n",uVar16 & 0xffffffff,
                            (ulong)*(uint *)(CONCAT44(local_4b8._4_4_,(uint)local_4b8) +
                                            (long)(int)local_438[uVar16] * 4));
                    uVar16 = uVar16 + 1;
                  } while ((long)uVar16 < (long)pRVar3->size_per);
                }
                fwrite("  RSS(ref_cell_add(ref_grid_qua(ref_grid),nodes,&cell),\"qua\");\n",0x3f,1,
                       pFVar12);
              }
              RVar22 = RVar22 + 1;
            } while (RVar22 < pRVar3->max);
          }
          if (local_4e0 != (REF_INT *)0x0) {
            free(local_4e0);
          }
          if ((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8) != (void *)0x0) {
            free((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8));
          }
          fclose(pFVar12);
          uVar16 = 0;
        }
        else {
          uVar16 = (ulong)uVar6;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x6a3,"ref_export_c",(ulong)uVar6,"compact");
        }
      }
      if ((int)uVar16 == 0) {
        return 0;
      }
      pcVar19 = "C export failed";
      uVar17 = 0xaa2;
    }
    else {
      iVar5 = strcmp(pcVar19,".tec");
      if (iVar5 == 0) {
        pFVar12 = fopen(filename,"w");
        if (pFVar12 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x2fa,"ref_export_tec","unable to open file");
          uVar16 = 2;
        }
        else {
          fwrite("title=\"tecplot refine geometry file\"\n",0x25,1,pFVar12);
          fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar12);
          local_4d8 = ref_grid->node;
          local_440 = ref_grid->cell;
          ppRVar11 = ref_grid->cell + 8;
          pRVar13 = (REF_NODE)0x8;
          do {
            pRVar3 = *ppRVar11;
            if (0 < pRVar3->n) {
              iVar5 = local_4d8->max;
              if ((long)iVar5 < 0) {
                pcVar19 = "malloc o2n of REF_INT negative";
                uVar17 = 0x2ac;
LAB_0012387e:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,uVar17,"ref_export_tec_vol_zone",pcVar19);
                uVar16 = 1;
              }
              else {
                uVar6 = pRVar3->node_per;
                sVar10 = (long)iVar5 * 4;
                local_448 = pRVar13;
                __s = malloc(sVar10);
                if (__s == (void *)0x0) {
                  pcVar19 = "malloc o2n of REF_INT NULL";
                  uVar17 = 0x2ac;
                }
                else {
                  if (iVar5 != 0) {
                    memset(__s,0xff,sVar10);
                  }
                  if (0 < pRVar3->max) {
                    iVar5 = 0;
                    RVar22 = 0;
                    do {
                      RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)local_438);
                      if (RVar8 == 0 && 0 < (int)uVar6) {
                        uVar16 = 0;
                        do {
                          if (*(int *)((long)__s + (long)(int)local_438[uVar16] * 4) == -1) {
                            *(int *)((long)__s + (long)(int)local_438[uVar16] * 4) = iVar5;
                            iVar5 = iVar5 + 1;
                          }
                          uVar16 = uVar16 + 1;
                        } while (uVar6 != uVar16);
                      }
                      RVar22 = RVar22 + 1;
                    } while (RVar22 < pRVar3->max);
                  }
                  iVar5 = local_4d8->max;
                  lVar21 = (long)iVar5;
                  if (lVar21 < 1) {
                    uVar16 = 0;
                  }
                  else {
                    lVar15 = 0;
                    uVar16 = 0;
                    do {
                      if (*(int *)((long)__s + lVar15 * 4) != -1) {
                        *(int *)((long)__s + lVar15 * 4) = (int)uVar16;
                        uVar16 = (ulong)((int)uVar16 + 1);
                      }
                      lVar15 = lVar15 + 1;
                    } while (lVar21 != lVar15);
                  }
                  iVar18 = (int)uVar16;
                  if (iVar18 < 0) {
                    pcVar19 = "malloc n2o of REF_INT negative";
                    uVar17 = 0x2c3;
                    goto LAB_0012387e;
                  }
                  __ptr = malloc(uVar16 << 2);
                  if (__ptr != (void *)0x0) {
                    if (0 < iVar5) {
                      lVar15 = 0;
                      do {
                        lVar14 = (long)*(int *)((long)__s + lVar15 * 4);
                        if (lVar14 != -1) {
                          *(int *)((long)__ptr + lVar14 * 4) = (int)lVar15;
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar21 != lVar15);
                    }
                    fprintf(pFVar12,
                            "zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                            (ulong)uVar6,uVar16,(ulong)(uint)pRVar3->n,"point","febrick");
                    pRVar13 = local_4d8;
                    if (iVar18 != 0) {
                      if (iVar18 < 2) {
                        uVar16 = 1;
                      }
                      uVar24 = 0;
                      do {
                        pRVar2 = pRVar13->real;
                        lVar21 = (long)*(int *)((long)__ptr + uVar24 * 4);
                        fprintf(pFVar12," %.16e %.16e %.16e\n",SUB84(pRVar2[lVar21 * 0xf],0),
                                pRVar2[lVar21 * 0xf + 1],pRVar2[lVar21 * 0xf + 2]);
                        uVar24 = uVar24 + 1;
                      } while (uVar16 != uVar24);
                    }
                    if (0 < pRVar3->max) {
                      iVar5 = 0;
                      do {
                        RVar8 = ref_cell_nodes(pRVar3,iVar5,(REF_INT *)local_438);
                        if (RVar8 != 0) goto LAB_00122f01;
                        switch(pRVar3->node_per) {
                        case 4:
                          iStack_4b0 = local_438[2];
                          iStack_4ac = local_438[2];
                          iStack_4a8 = local_438[3];
                          iStack_4a4 = local_438[3];
                          local_49c = local_438[3];
                          goto LAB_00122ec4;
                        case 5:
                          iStack_4b0 = local_438[2];
                          iStack_4ac = local_438[2];
                          iStack_4a8 = local_438[3];
                          iStack_4a4 = iStack_428;
                          iStack_4a0 = iStack_428;
                          local_49c = local_438[3];
                          break;
                        case 6:
                          iStack_4b0 = local_438[2];
                          iStack_4ac = local_438[2];
                          iStack_4a4 = iStack_428;
                          local_49c = iStack_424;
LAB_00122ec4:
                          iStack_4a8 = local_438[3];
                          iStack_4b0 = local_438[2];
                          iStack_4a0 = local_49c;
                          iStack_4ac = iStack_4b0;
                          break;
                        default:
                          bVar26 = false;
                          uVar16 = 6;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x2e2,"ref_export_tec_vol_zone",6,"wrong nodes per cell");
                          goto LAB_001238c0;
                        case 8:
                          local_4b8._0_4_ = local_438[0];
                          iStack_4ac = local_438[3];
                          iStack_4a8 = iStack_428;
                          iStack_4a4 = iStack_424;
                          iStack_4a0 = iStack_420;
                          local_49c = local_41c;
                        }
                        iStack_4b0 = local_438[2];
                        local_4b8._4_4_ = local_438[1];
                        local_4b8._0_4_ = local_438[0];
                        lVar21 = 0;
                        do {
                          fprintf(pFVar12," %d",
                                  (ulong)(*(int *)((long)__s +
                                                  (long)*(int *)((long)&local_4b8 + lVar21 * 4) * 4)
                                         + 1));
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != 8);
                        fputc(10,pFVar12);
LAB_00122f01:
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < pRVar3->max);
                    }
                    free(__ptr);
                    free(__s);
                    pRVar13 = local_448;
                    goto LAB_00122f28;
                  }
                  pcVar19 = "malloc n2o of REF_INT NULL";
                  uVar17 = 0x2c3;
                }
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,uVar17,"ref_export_tec_vol_zone",pcVar19);
                uVar16 = 2;
              }
              bVar26 = false;
              goto LAB_001238c0;
            }
LAB_00122f28:
            ppRVar11 = local_440 + (long)((long)&pRVar13->n + 1);
            pRVar13 = (REF_NODE)((long)&pRVar13->n + 1);
          } while (pRVar13 != (REF_NODE)0x10);
          uVar16 = 0;
          bVar26 = true;
LAB_001238c0:
          if (bVar26) {
            uVar6 = ref_export_tec_surf_zone(ref_grid,(FILE *)pFVar12);
            if (uVar6 == 0) {
              pRVar13 = ref_grid->node;
              uVar6 = ref_dict_create(&local_4c8);
              local_4d8 = (REF_NODE)CONCAT44(local_4d8._4_4_,(int)uVar16);
              if (uVar6 == 0) {
                pRVar3 = ref_grid->cell[4];
                if (0 < pRVar3->max) {
                  RVar22 = 0;
                  do {
                    RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)local_438);
                    if ((RVar8 == 0) &&
                       (uVar6 = ref_dict_store(local_4c8,local_438[pRVar3->node_per],-1), uVar6 != 0
                       )) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x1e3,"ref_export_tec_tr2_zone",(ulong)uVar6,"mark tri");
                      goto LAB_00124379;
                    }
                    RVar22 = RVar22 + 1;
                  } while (RVar22 < pRVar3->max);
                }
                if (local_4c8->n < 1) {
LAB_00123eef:
                  uVar6 = ref_dict_free(local_4c8);
                  if (uVar6 == 0) {
                    uVar6 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x206,"ref_export_tec_tr2_zone",(ulong)uVar6,"free dict");
                  }
                }
                else {
                  uVar9 = *local_4c8->key;
                  lVar21 = 0;
                  while( true ) {
                    uVar6 = ref_grid_cell_id_nodes
                                      (ref_grid,pRVar3,uVar9,(REF_INT *)&local_4cc,
                                       (REF_INT *)&local_4bc,(REF_INT **)&local_4b8,&local_4e0);
                    if (uVar6 != 0) break;
                    fprintf(pFVar12,
                            "zone t=\"p2face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)uVar9,(ulong)local_4cc,(ulong)(local_4bc << 2),"point",
                            "fetriangle");
                    if (0 < (int)local_4cc) {
                      lVar15 = 0;
                      do {
                        pRVar2 = pRVar13->real;
                        lVar14 = (long)local_4e0[lVar15];
                        fprintf(pFVar12," %.16e %.16e %.16e\n",SUB84(pRVar2[lVar14 * 0xf],0),
                                pRVar2[lVar14 * 0xf + 1],pRVar2[lVar14 * 0xf + 2]);
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < (int)local_4cc);
                    }
                    if (0 < pRVar3->max) {
                      iVar5 = 0;
                      do {
                        RVar8 = ref_cell_nodes(pRVar3,iVar5,(REF_INT *)local_438);
                        if ((RVar8 == 0) && (uVar9 == local_438[pRVar3->node_per])) {
                          lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                          fprintf(pFVar12," %d %d %d\n",
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[0] * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1));
                          lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                          fprintf(pFVar12," %d %d %d\n",
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[1] * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1));
                          lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                          fprintf(pFVar12," %d %d %d\n",
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[2] * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1));
                          lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                          fprintf(pFVar12," %d %d %d\n",
                                  (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1),
                                  (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1));
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < pRVar3->max);
                    }
                    if (local_4e0 != (REF_INT *)0x0) {
                      free(local_4e0);
                    }
                    if ((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8) != (void *)0x0) {
                      free((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8));
                    }
                    lVar21 = lVar21 + 1;
                    if (local_4c8->n <= lVar21) goto LAB_00123eef;
                    uVar9 = local_4c8->key[lVar21];
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x1e8,"ref_export_tec_tr2_zone",(ulong)uVar6,"extract this tri");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x1de,"ref_export_tec_tr2_zone",(ulong)uVar6,"create dict");
              }
LAB_00124379:
              uVar9 = (uint)local_4d8;
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x301,"ref_export_tec",(ulong)uVar6,"tr2");
                uVar9 = uVar6;
              }
              uVar16 = (ulong)uVar9;
              if (uVar6 == 0) {
                pRVar13 = ref_grid->node;
                uVar6 = ref_dict_create(&local_4c8);
                local_4d8 = (REF_NODE)CONCAT44(local_4d8._4_4_,uVar6);
                if (uVar6 == 0) {
                  pRVar3 = ref_grid->cell[5];
                  local_448 = pRVar13;
                  if (0 < pRVar3->max) {
                    iVar5 = 0;
                    do {
                      RVar8 = ref_cell_nodes(pRVar3,iVar5,(REF_INT *)local_438);
                      if ((RVar8 == 0) &&
                         (uVar6 = ref_dict_store(local_4c8,local_438[pRVar3->node_per],-1),
                         uVar6 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x21f,"ref_export_tec_tr3_zone",(ulong)uVar6,"mark tri");
                        local_4d8 = (REF_NODE)CONCAT44(local_4d8._4_4_,uVar6);
                        goto LAB_00124dc5;
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 < pRVar3->max);
                  }
                  if (local_4c8->n < 1) {
LAB_00124b7d:
                    uVar6 = ref_dict_free(local_4c8);
                    if (uVar6 == 0) {
                      local_4d8 = (REF_NODE)((ulong)local_4d8._4_4_ << 0x20);
                    }
                    else {
                      local_4d8 = (REF_NODE)CONCAT44(local_4d8._4_4_,uVar6);
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x24f,"ref_export_tec_tr3_zone",(ulong)uVar6,"free dict");
                    }
                  }
                  else {
                    uVar6 = *local_4c8->key;
                    lVar21 = 0;
                    while (uVar9 = ref_grid_cell_id_nodes
                                             (ref_grid,pRVar3,uVar6,(REF_INT *)&local_4cc,
                                              (REF_INT *)&local_4bc,(REF_INT **)&local_4b8,
                                              &local_4e0), uVar9 == 0) {
                      fprintf(pFVar12,
                              "zone t=\"p3face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                              ,(ulong)uVar6,(ulong)local_4cc,(ulong)(local_4bc * 9),"point",
                              "fetriangle");
                      pRVar13 = local_448;
                      if (0 < (int)local_4cc) {
                        lVar15 = 0;
                        do {
                          pRVar2 = pRVar13->real;
                          lVar14 = (long)local_4e0[lVar15];
                          fprintf(pFVar12," %.16e %.16e %.16e\n",SUB84(pRVar2[lVar14 * 0xf],0),
                                  pRVar2[lVar14 * 0xf + 1],pRVar2[lVar14 * 0xf + 2]);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < (int)local_4cc);
                      }
                      if (0 < pRVar3->max) {
                        iVar5 = 0;
                        do {
                          RVar8 = ref_cell_nodes(pRVar3,iVar5,(REF_INT *)local_438);
                          if ((RVar8 == 0) && (uVar6 == local_438[pRVar3->node_per])) {
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[0] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_418 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)local_418 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[1] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[2] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_41c * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_420 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)iStack_420 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_41c * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_424 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_420 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_41c * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)local_418 * 4) + 1));
                            lVar15 = CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                            fprintf(pFVar12," %d %d %d\n",
                                    (ulong)(*(int *)(lVar15 + (long)local_414 * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)(int)local_438[3] * 4) + 1),
                                    (ulong)(*(int *)(lVar15 + (long)iStack_428 * 4) + 1));
                          }
                          iVar5 = iVar5 + 1;
                        } while (iVar5 < pRVar3->max);
                      }
                      if (local_4e0 != (REF_INT *)0x0) {
                        free(local_4e0);
                      }
                      if ((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8) != (void *)0x0) {
                        free((void *)CONCAT44(local_4b8._4_4_,(uint)local_4b8));
                      }
                      lVar21 = lVar21 + 1;
                      if (local_4c8->n <= lVar21) goto LAB_00124b7d;
                      uVar6 = local_4c8->key[lVar21];
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x224,"ref_export_tec_tr3_zone",(ulong)uVar9,"extract this tri");
                    local_4d8 = (REF_NODE)CONCAT44(local_4d8._4_4_,uVar9);
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x21a,"ref_export_tec_tr3_zone",(ulong)uVar6,"create dict");
                }
LAB_00124dc5:
                pRVar13 = local_4d8;
                if ((uint)local_4d8 == 0) {
                  uVar6 = ref_export_tec_edg_zone(ref_grid,(FILE *)pFVar12);
                  if (uVar6 == 0) {
                    uVar6 = ref_export_tec_ed2_zone(ref_grid,(FILE *)pFVar12);
                    if (uVar6 == 0) {
                      uVar6 = ref_export_tec_ed3_zone(ref_grid,(FILE *)pFVar12);
                      if (uVar6 == 0) {
                        fclose(pFVar12);
                        uVar16 = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x305,"ref_export_tec",(ulong)uVar6,"ed3");
                        uVar16 = (ulong)uVar6;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x304,"ref_export_tec",(ulong)uVar6,"ed2");
                      uVar16 = (ulong)uVar6;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x303,"ref_export_tec",(ulong)uVar6,"edg");
                    uVar16 = (ulong)uVar6;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x302,"ref_export_tec",(ulong)local_4d8 & 0xffffffff,"tr3");
                  uVar16 = (ulong)pRVar13 & 0xffffffff;
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x300,"ref_export_tec",(ulong)uVar6,"surf");
              uVar16 = (ulong)uVar6;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x2ff,"ref_export_tec",uVar16,"vol");
          }
        }
        if ((int)uVar16 == 0) {
          return 0;
        }
        pcVar19 = "tec export failed";
        uVar17 = 0xaa4;
      }
      else {
        iVar5 = strcmp(pcVar19,".plt");
        if (iVar5 == 0) {
          uVar6 = ref_gather_by_extension(ref_grid,filename);
          if (uVar6 == 0) {
            return 0;
          }
          uVar16 = (ulong)uVar6;
          pcVar19 = "plt gather failed";
          uVar17 = 0xaa6;
        }
        else {
          iVar5 = strcmp(pcVar19,".eps");
          if (iVar5 == 0) {
            uVar6 = ref_export_eps(ref_grid,filename);
            if (uVar6 == 0) {
              return 0;
            }
            uVar16 = (ulong)uVar6;
            pcVar19 = "eps export failed";
            uVar17 = 0xaa8;
          }
          else {
            iVar5 = strcmp(pcVar19,".pdf");
            if (iVar5 == 0) {
              iStack_4a8 = 0x5f726f66;
              iStack_4a4 = 0x2e666470;
              iStack_4a0 = 0x737065;
              local_4b8._0_4_ = 0x5f666572;
              local_4b8._4_4_ = 0x6f707865;
              iStack_4b0 = 0x745f7472;
              iStack_4ac = 0x5f706d65;
              uVar6 = ref_export_eps(ref_grid,(char *)&local_4b8);
              uVar16 = (ulong)uVar6;
              if (uVar6 == 0) {
                snprintf((char *)local_438,0x400,"epstopdf %s -o=%s",&local_4b8,filename);
                iVar5 = system((char *)local_438);
                if (iVar5 == 0) {
                  iVar5 = remove((char *)&local_4b8);
                  if (iVar5 == 0) {
                    uVar16 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x6f9,"ref_export_pdf","temp clean up",0,(long)iVar5);
                    uVar16 = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x6f8,"ref_export_pdf","epstopdf failed",0,(long)iVar5);
                  uVar16 = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x6f6,"ref_export_pdf",(ulong)uVar6,"temp eps");
              }
              if ((int)uVar16 == 0) {
                return 0;
              }
              pcVar19 = "pdf export failed";
              uVar17 = 0xaaa;
            }
            else {
              iVar5 = strcmp(pcVar19,".su2");
              if (iVar5 != 0) {
                iVar5 = strcmp(filename + (sVar10 - 10),".lb8.ugrid");
                if (iVar5 == 0) {
                  uVar6 = ref_export_bin_ugrid(ref_grid,filename,0,0);
                  if (uVar6 == 0) {
                    return 0;
                  }
                  pcVar19 = "lb8.ugrid export failed";
                  uVar17 = 0xaaf;
                }
                else {
                  iVar5 = strcmp(filename + (sVar10 - 9),".b8.ugrid");
                  if (iVar5 == 0) {
                    uVar6 = ref_export_bin_ugrid(ref_grid,filename,1,0);
                    if (uVar6 == 0) {
                      return 0;
                    }
                    pcVar19 = "b8.ugrid export failed";
                    uVar17 = 0xab2;
                  }
                  else {
                    iVar5 = strcmp(filename + (sVar10 - 0xb),".lb8l.ugrid");
                    if (iVar5 != 0) {
                      iVar5 = strcmp(filename + (sVar10 - 10),".b8l.ugrid");
                      if (iVar5 == 0) {
                        uVar6 = ref_export_bin_ugrid(ref_grid,filename,1,1);
                        if (uVar6 == 0) {
                          return 0;
                        }
                        uVar16 = (ulong)uVar6;
                        pcVar19 = "b8l.ugrid export failed";
                        uVar17 = 0xab8;
                      }
                      else {
                        iVar5 = strcmp(filename + (sVar10 - 0xc),".lb8.ugrid64");
                        if (iVar5 == 0) {
                          uVar6 = ref_export_bin_ugrid(ref_grid,filename,0,1);
                          if (uVar6 == 0) {
                            return 0;
                          }
                          pcVar19 = "lb8.ugrid64 export failed";
                          uVar17 = 0xabb;
                          goto LAB_00123c40;
                        }
                        iVar5 = strcmp(filename + (sVar10 - 0xb),".b8.ugrid64");
                        if (iVar5 == 0) {
                          uVar6 = ref_export_bin_ugrid(ref_grid,filename,1,1);
                          if (uVar6 == 0) {
                            return 0;
                          }
                          uVar16 = (ulong)uVar6;
                          pcVar19 = "b8.ugrid64 export failed";
                          uVar17 = 0xabe;
                        }
                        else {
                          __s1 = filename + (sVar10 - 6);
                          iVar5 = strcmp(__s1,".ugrid");
                          if (iVar5 == 0) {
                            uVar6 = ref_export_ugrid(ref_grid,filename);
                            if (uVar6 == 0) {
                              return 0;
                            }
                            uVar16 = (ulong)uVar6;
                            pcVar19 = "ugrid export failed";
                            uVar17 = 0xac0;
                          }
                          else {
                            __s1_00 = filename + (sVar10 - 5);
                            iVar5 = strcmp(__s1_00,".grid");
                            if (iVar5 == 0) {
                              uVar6 = ref_export_i_like_cfd_grid(ref_grid,filename);
                              if (uVar6 == 0) {
                                return 0;
                              }
                              uVar16 = (ulong)uVar6;
                              pcVar19 = "grid export failed";
                              uVar17 = 0xac2;
                            }
                            else {
                              iVar5 = strcmp(__s1_00,".poly");
                              if (iVar5 == 0) {
                                uVar6 = ref_export_poly(ref_grid,filename);
                                if (uVar6 == 0) {
                                  return 0;
                                }
                                uVar16 = (ulong)uVar6;
                                pcVar19 = "poly export failed";
                                uVar17 = 0xac4;
                              }
                              else {
                                iVar5 = strcmp(__s1,".smesh");
                                if (iVar5 == 0) {
                                  uVar6 = ref_export_smesh(ref_grid,filename);
                                  if (uVar6 == 0) {
                                    return 0;
                                  }
                                  uVar16 = (ulong)uVar6;
                                  pcVar19 = "smesh export failed";
                                  uVar17 = 0xac6;
                                }
                                else {
                                  iVar5 = strcmp(__s1,".fgrid");
                                  if (iVar5 == 0) {
                                    uVar6 = ref_export_fgrid(ref_grid,filename);
                                    if (uVar6 == 0) {
                                      return 0;
                                    }
                                    uVar16 = (ulong)uVar6;
                                    pcVar19 = "fgrid export failed";
                                    uVar17 = 0xac8;
                                  }
                                  else {
                                    iVar5 = strcmp(__s1_00,".html");
                                    if (iVar5 == 0) {
                                      uVar6 = ref_export_html(ref_grid,filename);
                                      if (uVar6 == 0) {
                                        return 0;
                                      }
                                      uVar16 = (ulong)uVar6;
                                      pcVar19 = "html export failed";
                                      uVar17 = 0xaca;
                                    }
                                    else {
                                      iVar5 = strcmp(__s1,".meshb");
                                      if (iVar5 == 0) {
                                        uVar6 = ref_export_meshb(ref_grid,filename);
                                        if (uVar6 == 0) {
                                          return 0;
                                        }
                                        uVar16 = (ulong)uVar6;
                                        pcVar19 = "meshb export failed";
                                        uVar17 = 0xacc;
                                      }
                                      else {
                                        iVar5 = strcmp(filename + (sVar10 - 9),"-bamg.msh");
                                        if (iVar5 == 0) {
                                          uVar6 = ref_export_bamg_msh(ref_grid,filename);
                                          if (uVar6 == 0) {
                                            return 0;
                                          }
                                          uVar16 = (ulong)uVar6;
                                          pcVar19 = "bamg msh export failed";
                                          uVar17 = 0xace;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar19,".msh");
                                          if (iVar5 == 0) {
                                            uVar6 = ref_export_msh(ref_grid,filename);
                                            if (uVar6 == 0) {
                                              return 0;
                                            }
                                            uVar16 = (ulong)uVar6;
                                            pcVar19 = "msh export failed";
                                            uVar17 = 0xad0;
                                          }
                                          else {
                                            iVar5 = strcmp(__s1_00,".msh2");
                                            if (iVar5 == 0) {
                                              uVar6 = ref_export_msh2(ref_grid,filename);
                                              if (uVar6 == 0) {
                                                return 0;
                                              }
                                              uVar16 = (ulong)uVar6;
                                              pcVar19 = "msh2 export failed";
                                              uVar17 = 0xad2;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar19,".tri");
                                              if (iVar5 == 0) {
                                                uVar6 = ref_export_tri(ref_grid,filename);
                                                if (uVar6 == 0) {
                                                  return 0;
                                                }
                                                uVar16 = (ulong)uVar6;
                                                pcVar19 = "tri export failed";
                                                uVar17 = 0xad4;
                                              }
                                              else {
                                                uVar6 = ref_gather_by_extension(ref_grid,filename);
                                                if (uVar6 == 0) {
                                                  return 0;
                                                }
                                                uVar16 = (ulong)uVar6;
                                                pcVar19 = "export via gather";
                                                uVar17 = 0xad6;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_001239ad;
                    }
                    uVar6 = ref_export_bin_ugrid(ref_grid,filename,0,1);
                    if (uVar6 == 0) {
                      return 0;
                    }
                    pcVar19 = "lb8l.ugrid export failed";
                    uVar17 = 0xab5;
                  }
                }
LAB_00123c40:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,uVar17,"ref_export_by_extension",(ulong)uVar6,pcVar19);
                return uVar6;
              }
              pRVar13 = ref_grid->node;
              pFVar12 = fopen(filename,"w");
              if (pFVar12 == (FILE *)0x0) {
                printf("unable to open %s\n",filename);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x4da,"ref_export_su2","unable to open file");
                uVar16 = 2;
              }
              else {
                pcVar19 = "NDIME= 2\n";
                if (ref_grid->twod == 0) {
                  pcVar19 = "NDIME= 3\n";
                }
                fwrite(pcVar19,9,1,pFVar12);
                uVar6 = ref_node_compact(pRVar13,&local_4e0,(REF_INT **)&local_4c8);
                uVar16 = (ulong)uVar6;
                if (uVar6 == 0) {
                  local_4d8 = (REF_NODE)((ulong)local_4d8 & 0xffffffff00000000);
                  fprintf(pFVar12,"NPOIN= %d\n",(ulong)(uint)pRVar13->n);
                  if (ref_grid->twod == 0) {
                    if (0 < pRVar13->n) {
                      lVar21 = 0;
                      do {
                        pRVar2 = pRVar13->real;
                        lVar15 = (long)(&local_4c8->n)[lVar21];
                        fprintf(pFVar12," %.16e %.16e %.16e\n",SUB84(pRVar2[lVar15 * 0xf],0),
                                pRVar2[lVar15 * 0xf + 1],pRVar2[lVar15 * 0xf + 2]);
                        lVar21 = lVar21 + 1;
                      } while (lVar21 < pRVar13->n);
                    }
                  }
                  else if (0 < pRVar13->n) {
                    lVar21 = 0;
                    do {
                      fprintf(pFVar12," %.16e %.16e\n",
                              SUB84(pRVar13->real[(long)(&local_4c8->n)[lVar21] * 0xf],0),
                              pRVar13->real[(long)(&local_4c8->n)[lVar21] * 0xf + 1]);
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < pRVar13->n);
                  }
                  if (ref_grid->twod == 0) {
                    ppRVar11 = ref_grid->cell + 8;
                    bVar26 = false;
                    fprintf(pFVar12,"NELEM= %d\n",
                            (ulong)(uint)(ref_grid->cell[9]->n + ref_grid->cell[8]->n +
                                          ref_grid->cell[10]->n + ref_grid->cell[0xb]->n));
                    uVar16 = 8;
                    do {
                      pRVar3 = *ppRVar11;
                      if (0 < pRVar3->max) {
                        RVar22 = 0;
                        do {
                          RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)&local_4b8);
                          if (RVar8 != 0) goto LAB_00124243;
                          switch(pRVar3->type) {
                          case REF_CELL_EDG:
                          case REF_CELL_ED2:
                          case REF_CELL_ED3:
                          case REF_CELL_TRI:
                          case REF_CELL_TR2:
                          case REF_CELL_TR3:
                          case REF_CELL_QUA:
                          case REF_CELL_QU2:
                          case REF_CELL_TE2:
                          case REF_CELL_PY2:
                          case REF_CELL_PR2:
                          case REF_CELL_HE2:
                            uVar16 = 6;
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0x53d,"ref_export_su2",6,"3D SU2 element");
                            goto LAB_001242e9;
                          case REF_CELL_TET:
                            pcVar19 = "10";
                            goto LAB_001241a0;
                          case REF_CELL_PYR:
                            fwrite("14",2,1,pFVar12);
                            iVar5 = iStack_4b0;
                            uVar6 = (uint)local_4b8;
                            local_4b8._0_4_ = local_4b8._4_4_;
                            local_4b8._4_4_ = uVar6;
                            iStack_4b0 = iStack_4ac;
                            iStack_4ac = iStack_4a8;
                            iStack_4a8 = iVar5;
                            break;
                          case REF_CELL_PRI:
                            fwrite("13",2,1,pFVar12);
                            iVar5 = iStack_4ac;
                            uVar6 = (uint)local_4b8;
                            local_4b8._0_4_ = local_4b8._4_4_;
                            local_4b8._4_4_ = uVar6;
                            iStack_4ac = iStack_4a8;
                            iStack_4a8 = iVar5;
                            break;
                          case REF_CELL_HEX:
                            pcVar19 = "12";
LAB_001241a0:
                            fwrite(pcVar19,2,1,pFVar12);
                          }
                          if (0 < pRVar3->node_per) {
                            lVar21 = 0;
                            do {
                              fprintf(pFVar12," %d",
                                      (ulong)(uint)local_4e0[*(int *)((long)&local_4b8 + lVar21 * 4)
                                                            ]);
                              lVar21 = lVar21 + 1;
                            } while (lVar21 < pRVar3->node_per);
                          }
                          fputc(10,pFVar12);
LAB_00124243:
                          RVar22 = RVar22 + 1;
                        } while (RVar22 < pRVar3->max);
                      }
                      ppRVar11 = ref_grid->cell + uVar16 + 1;
                      bVar26 = 0xe < uVar16;
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != 0x10);
                  }
                  else {
                    ppRVar11 = ref_grid->cell + 3;
                    bVar26 = false;
                    fprintf(pFVar12,"NELEM= %d\n",
                            (ulong)(uint)(ref_grid->cell[6]->n + ref_grid->cell[3]->n));
                    uVar16 = 3;
                    do {
                      pRVar3 = *ppRVar11;
                      if (0 < pRVar3->max) {
                        RVar22 = 0;
                        do {
                          RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)&local_4b8);
                          if (RVar8 == 0) {
                            RVar1 = pRVar3->type;
                            if (RVar1 < 0x10) {
                              iVar5 = 0x35;
                              if (RVar1 != REF_CELL_TRI) {
                                if (RVar1 != REF_CELL_QUA) {
                                  uVar16 = 6;
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                         ,0x510,"ref_export_su2",6,"2D SU2 element");
                                  goto LAB_001242e9;
                                }
                                iVar5 = 0x39;
                              }
                              fputc(iVar5,pFVar12);
                            }
                            if (0 < pRVar3->node_per) {
                              lVar21 = 0;
                              do {
                                fprintf(pFVar12," %d",
                                        (ulong)(uint)local_4e0[*(int *)((long)&local_4b8 +
                                                                       lVar21 * 4)]);
                                lVar21 = lVar21 + 1;
                              } while (lVar21 < pRVar3->node_per);
                            }
                            fputc(10,pFVar12);
                          }
                          RVar22 = RVar22 + 1;
                        } while (RVar22 < pRVar3->max);
                      }
                      ppRVar11 = ref_grid->cell + uVar16 + 1;
                      bVar26 = 6 < uVar16;
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != 8);
                  }
                  uVar16 = (ulong)local_4d8 & 0xffffffff;
LAB_001242e9:
                  if (bVar26) {
                    if (ref_grid->twod == 0) {
                      ref_export_faceid_range(ref_grid,(REF_INT *)local_438,(REF_INT *)&local_4bc);
                      fprintf(pFVar12,"NMARK= %d\n",(ulong)((local_4bc - local_438[0]) + 1));
                      uVar6 = local_438[0];
                      if ((int)local_438[0] <= (int)local_4bc) {
                        do {
                          local_4f8 = (ulong)uVar6;
                          pRVar3 = ref_grid->cell[3];
                          iVar5 = 0;
                          if (0 < pRVar3->max) {
                            iVar18 = pRVar3->node_per;
                            iVar5 = 0;
                            iVar23 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,iVar23,(REF_INT *)&local_4b8);
                              if (RVar8 == 0) {
                                iVar5 = iVar5 + (uint)(*(uint *)((long)&local_4b8 + (long)iVar18 * 4
                                                                ) == uVar6);
                              }
                              iVar23 = iVar23 + 1;
                            } while (iVar23 < pRVar3->max);
                          }
                          pRVar3 = ref_grid->cell[6];
                          if (pRVar3->max < 1) {
                            iVar18 = 0;
                          }
                          else {
                            iVar23 = pRVar3->node_per;
                            iVar18 = 0;
                            RVar22 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)&local_4b8);
                              if (RVar8 == 0) {
                                iVar18 = iVar18 + (uint)(*(uint *)((long)&local_4b8 +
                                                                  (long)iVar23 * 4) == uVar6);
                              }
                              RVar22 = RVar22 + 1;
                            } while (RVar22 < pRVar3->max);
                          }
                          fprintf(pFVar12,"MARKER_TAG= %d\n",local_4f8);
                          fprintf(pFVar12,"MARKER_ELEMS= %d\n",(ulong)(uint)(iVar18 + iVar5));
                          pRVar3 = ref_grid->cell[3];
                          if (0 < pRVar3->max) {
                            uVar9 = pRVar3->node_per;
                            RVar22 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)&local_4b8);
                              if ((RVar8 == 0) &&
                                 (*(uint *)((long)&local_4b8 + (long)(int)uVar9 * 4) == uVar6)) {
                                fputc(0x35,pFVar12);
                                if (0 < (int)uVar9) {
                                  uVar16 = 0;
                                  do {
                                    fprintf(pFVar12," %d",
                                            (ulong)(uint)local_4e0[*(int *)((long)&local_4b8 +
                                                                           uVar16 * 4)]);
                                    uVar16 = uVar16 + 1;
                                  } while (uVar9 != uVar16);
                                }
                                fputc(10,pFVar12);
                              }
                              RVar22 = RVar22 + 1;
                            } while (RVar22 < pRVar3->max);
                          }
                          pRVar3 = ref_grid->cell[6];
                          if (0 < pRVar3->max) {
                            uVar9 = pRVar3->node_per;
                            RVar22 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)&local_4b8);
                              if ((RVar8 == 0) &&
                                 (*(uint *)((long)&local_4b8 + (long)(int)uVar9 * 4) == uVar6)) {
                                fputc(0x39,pFVar12);
                                if (0 < (int)uVar9) {
                                  uVar16 = 0;
                                  do {
                                    fprintf(pFVar12," %d",
                                            (ulong)(uint)local_4e0[*(int *)((long)&local_4b8 +
                                                                           uVar16 * 4)]);
                                    uVar16 = uVar16 + 1;
                                  } while (uVar9 != uVar16);
                                }
                                fputc(10,pFVar12);
                              }
                              RVar22 = RVar22 + 1;
                            } while (RVar22 < pRVar3->max);
                          }
                          bVar26 = uVar6 != local_4bc;
                          uVar6 = uVar6 + 1;
                        } while (bVar26);
                      }
                    }
                    else {
                      pRVar3 = ref_grid->cell[0];
                      if (pRVar3->max < 1) {
                        uVar6 = 0x80000000;
                        local_4f8 = 0x7fffffff;
                      }
                      else {
                        RVar22 = 0;
                        uVar6 = 0x80000000;
                        local_4f8 = 0x7fffffff;
                        do {
                          RVar8 = ref_cell_nodes(pRVar3,RVar22,(REF_INT *)local_438);
                          if (RVar8 == 0) {
                            uVar9 = local_438[pRVar3->node_per];
                            if ((int)uVar9 <= (int)local_4f8) {
                              local_4f8 = (ulong)uVar9;
                            }
                            if ((int)uVar6 <= (int)uVar9) {
                              uVar6 = uVar9;
                            }
                          }
                          RVar22 = RVar22 + 1;
                        } while (RVar22 < pRVar3->max);
                      }
                      fprintf(pFVar12,"NMARK= %d\n",(ulong)((uVar6 - (int)local_4f8) + 1));
                      if ((int)local_4f8 <= (int)uVar6) {
                        do {
                          pRVar3 = ref_grid->cell[0];
                          uVar20 = 0;
                          uVar9 = (uint)local_4f8;
                          if (0 < pRVar3->max) {
                            iVar5 = pRVar3->node_per;
                            uVar20 = 0;
                            iVar18 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,iVar18,(REF_INT *)&local_4b8);
                              if (RVar8 == 0) {
                                uVar20 = uVar20 + (*(uint *)((long)&local_4b8 + (long)iVar5 * 4) ==
                                                  uVar9);
                              }
                              iVar18 = iVar18 + 1;
                            } while (iVar18 < pRVar3->max);
                          }
                          fprintf(pFVar12,"MARKER_TAG= %d\n",local_4f8);
                          fprintf(pFVar12,"MARKER_ELEMS= %d\n",(ulong)uVar20);
                          pRVar3 = ref_grid->cell[0];
                          if (0 < pRVar3->max) {
                            uVar20 = pRVar3->node_per;
                            iVar5 = 0;
                            do {
                              RVar8 = ref_cell_nodes(pRVar3,iVar5,(REF_INT *)&local_4b8);
                              if ((RVar8 == 0) &&
                                 (*(uint *)((long)&local_4b8 + (long)(int)uVar20 * 4) == uVar9)) {
                                fputc(0x33,pFVar12);
                                if (0 < (int)uVar20) {
                                  uVar16 = 0;
                                  do {
                                    fprintf(pFVar12," %d",
                                            (ulong)(uint)local_4e0[*(int *)((long)&local_4b8 +
                                                                           uVar16 * 4)]);
                                    uVar16 = uVar16 + 1;
                                  } while (uVar20 != uVar16);
                                }
                                fputc(10,pFVar12);
                              }
                              iVar5 = iVar5 + 1;
                            } while (iVar5 < pRVar3->max);
                          }
                          local_4f8 = (ulong)(uVar9 + 1);
                        } while (uVar9 != uVar6);
                      }
                    }
                    if (local_4c8 != (REF_DICT)0x0) {
                      free(local_4c8);
                    }
                    if (local_4e0 != (REF_INT *)0x0) {
                      free(local_4e0);
                    }
                    fclose(pFVar12);
                    uVar16 = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x4e2,"ref_export_su2",uVar16,"compact");
                }
              }
              if ((int)uVar16 == 0) {
                return 0;
              }
              pcVar19 = "su2 export failed";
              uVar17 = 0xaac;
            }
          }
        }
      }
    }
  }
LAB_001239ad:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar17,
         "ref_export_by_extension",uVar16,pcVar19);
  return (REF_STATUS)uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_export_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 4], ".vtk") == 0) {
    RSS(ref_export_vtk(ref_grid, filename), "vtk export failed");
  } else if (strcmp(&filename[end_of_string - 2], ".c") == 0) {
    RSS(ref_export_c(ref_grid, filename), "C export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tec") == 0) {
    RSS(ref_export_tec(ref_grid, filename), "tec export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_by_extension(ref_grid, filename), "plt gather failed");
  } else if (strcmp(&filename[end_of_string - 4], ".eps") == 0) {
    RSS(ref_export_eps(ref_grid, filename), "eps export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".pdf") == 0) {
    RSS(ref_export_pdf(ref_grid, filename), "pdf export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_export_su2(ref_grid, filename), "su2 export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        "lb8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        "b8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_export_ugrid(ref_grid, filename), "ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_export_i_like_cfd_grid(ref_grid, filename), "grid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".poly") == 0) {
    RSS(ref_export_poly(ref_grid, filename), "poly export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".smesh") == 0) {
    RSS(ref_export_smesh(ref_grid, filename), "smesh export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_export_fgrid(ref_grid, filename), "fgrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".html") == 0) {
    RSS(ref_export_html(ref_grid, filename), "html export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_export_meshb(ref_grid, filename), "meshb export failed");
  } else if (strcmp(&filename[end_of_string - 9], "-bamg.msh") == 0) {
    RSS(ref_export_bamg_msh(ref_grid, filename), "bamg msh export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_export_msh(ref_grid, filename), "msh export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".msh2") == 0) {
    RSS(ref_export_msh2(ref_grid, filename), "msh2 export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_export_tri(ref_grid, filename), "tri export failed");
  } else {
    RSS(ref_gather_by_extension(ref_grid, filename), "export via gather");
  }

  return REF_SUCCESS;
}